

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputOptions.cpp
# Opt level: O0

bool __thiscall
nvtt::InputOptions::setMipmapData
          (InputOptions *this,void *data,int width,int height,int depth,int face,int mipLevel)

{
  int iVar1;
  Image *pIVar2;
  Color32 *__dest;
  int idx;
  int face_local;
  int depth_local;
  int height_local;
  int width_local;
  void *data_local;
  InputOptions *this_local;
  
  if ((depth != 1) &&
     (iVar1 = nvAbort("depth == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvtt/InputOptions.cpp"
                      ,0xc0,
                      "bool nvtt::InputOptions::setMipmapData(const void *, int, int, int, int, int)"
                     ), iVar1 == 1)) {
    raise(5);
  }
  iVar1 = face * this->m->mipmapCount + mipLevel;
  if ((((this->m->images[iVar1].width == width) && (this->m->images[iVar1].height == height)) &&
      (this->m->images[iVar1].depth == depth)) &&
     ((this->m->images[iVar1].mipLevel == mipLevel && (this->m->images[iVar1].face == face)))) {
    pIVar2 = (Image *)operator_new(0x18);
    nv::Image::Image(pIVar2);
    nv::AutoPtr<nv::Image>::operator=(&this->m->images[iVar1].data,pIVar2);
    pIVar2 = nv::AutoPtr<nv::Image>::operator->(&this->m->images[iVar1].data);
    nv::Image::allocate(pIVar2,width,height);
    pIVar2 = nv::AutoPtr<nv::Image>::operator->(&this->m->images[iVar1].data);
    __dest = nv::Image::pixels(pIVar2);
    memcpy(__dest,data,(long)(width * height * 4));
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool InputOptions::setMipmapData(const void * data, int width, int height, int depth /*= 1*/, int face /*= 0*/, int mipLevel /*= 0*/)
{
	nvCheck(depth == 1);
	
	const int idx = face * m.mipmapCount + mipLevel;
	
	if (m.images[idx].width != width || m.images[idx].height != height || m.images[idx].depth != depth || m.images[idx].mipLevel != mipLevel || m.images[idx].face != face)
	{
		// Invalid dimension or index.
		return false;
	}
	
	m.images[idx].data = new nv::Image();
	m.images[idx].data->allocate(width, height);
	memcpy(m.images[idx].data->pixels(), data, width * height * 4); 
	
	return true;
}